

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::CopyImage::SmokeTest::iterate(SmokeTest *this)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 err;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference test_case_00;
  TestContext *pTVar5;
  size_type sVar6;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1e8;
  Exception *exc;
  undefined1 auStack_58 [4];
  GLuint ignored;
  testCase desc;
  testCase *test_case;
  GLubyte *src_pixels;
  bool result;
  long lStack_20;
  IterateResult it_result;
  Functions *gl;
  GLubyte *dst_pixels;
  SmokeTest *this_local;
  
  gl = (Functions *)0x0;
  dst_pixels = (GLubyte *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  src_pixels._4_4_ = STOP;
  src_pixels._3_1_ = 0;
  test_case = (testCase *)0x0;
  test_case_00 = std::
                 vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
                 ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  (**(code **)(lStack_20 + 0xff0))(0xd05);
  (**(code **)(lStack_20 + 0xff0))(0xcf5,1);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"PixelStorei",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfbc);
  prepareDstPxls(this,test_case_00,(GLubyte **)&gl);
  prepareSrcPxls(this,test_case_00,(GLubyte **)&test_case);
  if (test_case_00->m_target == 0x8d41) {
    uVar1 = test_case_00->m_internal_format;
    desc.m_target = test_case_00->m_format;
    desc.m_internal_format = test_case_00->m_type;
    exc._4_4_ = 0;
    ignored = uVar1;
    auStack_58 = (undefined1  [4])0xde1;
    GVar3 = prepareTexture(this,test_case_00,(GLubyte *)0x0,(GLuint *)((long)&exc + 4));
    this->m_rb_name = GVar3;
    GVar3 = prepareTexture(this,(testCase *)auStack_58,(GLubyte *)gl,&this->m_dst_buf_name);
    this->m_dst_tex_name = GVar3;
    GVar3 = prepareTexture(this,(testCase *)auStack_58,(GLubyte *)test_case,&this->m_src_buf_name);
    this->m_src_tex_name = GVar3;
  }
  else {
    GVar3 = prepareTexture(this,test_case_00,(GLubyte *)gl,&this->m_dst_buf_name);
    this->m_dst_tex_name = GVar3;
    GVar3 = prepareTexture(this,test_case_00,(GLubyte *)test_case,&this->m_src_buf_name);
    this->m_src_tex_name = GVar3;
  }
  src_pixels._3_1_ = copyAndVerify(this,test_case_00,(GLubyte *)test_case);
  clean(this);
  cleanPixels(this,(GLubyte **)&gl);
  cleanPixels(this,(GLubyte **)&test_case);
  if ((src_pixels._3_1_ & 1) == 1) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_PASS,"Pass");
    this->m_test_case_index = this->m_test_case_index + 1;
    sVar6 = std::
            vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
            ::size(&this->m_test_cases);
    if (this->m_test_case_index < sVar6) {
      src_pixels._4_4_ = CONTINUE;
    }
  }
  else {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_00 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [10])"Failure. ");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_FAIL,"Fail");
  }
  return src_pixels._4_4_;
}

Assistant:

tcu::TestNode::IterateResult SmokeTest::iterate()
{
	GLubyte*					 dst_pixels = 0;
	const Functions&			 gl			= m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result  = tcu::TestNode::STOP;
	bool						 result		= false;
	GLubyte*					 src_pixels = 0;
	const testCase&				 test_case  = m_test_cases[m_test_case_index];

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "PixelStorei");

	try
	{
		/* Prepare pixels */
		prepareDstPxls(test_case, dst_pixels);
		prepareSrcPxls(test_case, src_pixels);

		/* Prepare textures */
		if (GL_RENDERBUFFER == test_case.m_target)
		{
			testCase desc	= test_case;
			GLuint   ignored = 0;

			desc.m_target = GL_TEXTURE_2D;

			m_rb_name	  = prepareTexture(test_case, 0 /* pixels */, ignored /* buffer name */);
			m_dst_tex_name = prepareTexture(desc, dst_pixels, m_dst_buf_name);
			m_src_tex_name = prepareTexture(desc, src_pixels, m_src_buf_name);
		}
		else
		{
			m_dst_tex_name = prepareTexture(test_case, dst_pixels, m_dst_buf_name);
			m_src_tex_name = prepareTexture(test_case, src_pixels, m_src_buf_name);
		}

		/* Copy images and verify results */
		result = copyAndVerify(test_case, src_pixels);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		cleanPixels(dst_pixels);
		cleanPixels(src_pixels);
		throw exc;
	}

	/* Free resources */
	clean();
	cleanPixels(dst_pixels);
	cleanPixels(src_pixels);

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failure. " << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}